

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_stdout_to_file(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  uv_loop_t *loop;
  uv_timer_t *loop_00;
  int extraout_EDX;
  char *pcVar6;
  char *pcVar7;
  void *unaff_RBP;
  int iVar8;
  uv_stream_t *handle;
  uv_process_t *puVar9;
  uv_timer_t *puVar10;
  code *pcVar11;
  uv_process_options_t *unaff_R14;
  undefined8 unaff_R15;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uv_stdio_container_t stdio [2];
  uv_fs_t fs_req;
  uv_os_fd_t uStackY_e6c;
  sockaddr_in sStackY_e68;
  uv_stdio_container_t uStackY_e58;
  undefined4 uStackY_e48;
  undefined4 uStackY_e40;
  undefined4 uStackY_e38;
  undefined4 uStackY_e30;
  undefined4 uStackY_e28;
  int iStackY_e20;
  uv_loop_t *puStackY_e18;
  uv_tcp_t uStackY_e10;
  uv_stdio_container_t uStackY_d18;
  undefined4 uStackY_d08;
  undefined4 uStackY_cf8;
  undefined4 uStackY_ce8;
  uv_loop_t *puStackY_ce0;
  undefined1 auStackY_cd0 [272];
  anon_union_8_2_26168aa3_for_data aStackY_bc0;
  code *pcStackY_bb8;
  code *pcStackY_bb0;
  void *pvStackY_ba8;
  undefined1 auStackY_ba0 [40];
  uv_stdio_container_t uStackY_b78;
  int iStackY_b68;
  uv_handle_type *puStackY_b60;
  uv_stream_t uStackY_b58;
  uv_handle_type auStackY_a50 [114];
  uv_loop_t *puStackY_888;
  uv_fs_t *puStackY_880;
  code *pcStackY_878;
  uv_buf_t uStack_868;
  uv_fs_t uStack_858;
  uv_stdio_container_t uStack_6a0;
  undefined4 uStack_690;
  uint uStack_688;
  undefined4 uStack_680;
  uint uStack_678;
  uv_loop_t *puStack_668;
  uv_fs_t *puStack_660;
  uv_buf_t uStack_638;
  uv_stdio_container_t uStack_628;
  undefined4 uStack_618;
  uint uStack_610;
  undefined4 uStack_608;
  uint uStack_600;
  uv_fs_t uStack_5f0;
  uv_loop_t *puStack_438;
  uv_fs_t *puStack_430;
  uv_buf_t uStack_410;
  uv_stdio_container_t uStack_400;
  undefined4 uStack_3f0;
  uint uStack_3e8;
  undefined4 uStack_3e0;
  uint uStack_3d8;
  uv_fs_t uStack_3d0;
  uv_loop_t *puStack_218;
  uv_fs_t *puStack_210;
  uv_buf_t local_1f8;
  uv_stdio_container_t local_1e8;
  undefined4 local_1d8;
  uint local_1d0;
  uv_fs_t local_1c8;
  
  pcVar6 = "stdout_file";
  puStack_210 = (uv_fs_t *)0x176d8b;
  unlink("stdout_file");
  puStack_210 = (uv_fs_t *)0x176d9e;
  init_process_options("spawn_helper2",exit_cb);
  puStack_210 = (uv_fs_t *)0x176dbb;
  uVar1 = uv_fs_open((uv_loop_t *)0x0,&local_1c8,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  if (uVar1 == 0xffffffff) {
    puStack_210 = (uv_fs_t *)0x176f4f;
    run_test_spawn_stdout_to_file_cold_9();
LAB_00176f4f:
    puStack_210 = (uv_fs_t *)0x176f54;
    run_test_spawn_stdout_to_file_cold_1();
LAB_00176f54:
    puStack_210 = (uv_fs_t *)0x176f59;
    run_test_spawn_stdout_to_file_cold_2();
LAB_00176f59:
    puStack_210 = (uv_fs_t *)0x176f5e;
    run_test_spawn_stdout_to_file_cold_3();
LAB_00176f5e:
    puStack_210 = (uv_fs_t *)0x176f63;
    run_test_spawn_stdout_to_file_cold_4();
LAB_00176f63:
    puStack_210 = (uv_fs_t *)0x176f68;
    run_test_spawn_stdout_to_file_cold_5();
LAB_00176f68:
    puStack_210 = (uv_fs_t *)0x176f6d;
    run_test_spawn_stdout_to_file_cold_6();
LAB_00176f6d:
    puStack_210 = (uv_fs_t *)0x176f72;
    run_test_spawn_stdout_to_file_cold_7();
  }
  else {
    pcVar6 = (char *)(ulong)uVar1;
    puStack_210 = (uv_fs_t *)0x176dd0;
    uv_fs_req_cleanup(&local_1c8);
    options.stdio = &local_1e8;
    unaff_R14 = &options;
    local_1e8.flags = UV_IGNORE;
    local_1d8 = 2;
    options.stdio_count = 2;
    puStack_210 = (uv_fs_t *)0x176dff;
    local_1d0 = uVar1;
    puVar4 = uv_default_loop();
    puStack_210 = (uv_fs_t *)0x176e11;
    iVar2 = uv_spawn(puVar4,&process,&options);
    if (iVar2 != 0) goto LAB_00176f4f;
    puStack_210 = (uv_fs_t *)0x176e1e;
    puVar4 = uv_default_loop();
    puStack_210 = (uv_fs_t *)0x176e28;
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_00176f54;
    if (exit_cb_called != 1) goto LAB_00176f59;
    if (close_cb_called != 1) goto LAB_00176f5e;
    puStack_210 = (uv_fs_t *)0x176e5b;
    local_1f8 = uv_buf_init(output,0x400);
    puStack_210 = (uv_fs_t *)0x176e86;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&local_1c8,uVar1,&local_1f8,1,0,(uv_fs_cb)0x0);
    if (iVar2 != 0xc) goto LAB_00176f63;
    unaff_R14 = (uv_process_options_t *)&local_1c8;
    puStack_210 = (uv_fs_t *)0x176e9c;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    puStack_210 = (uv_fs_t *)0x176eaa;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar1,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00176f68;
    puStack_210 = (uv_fs_t *)0x176ebc;
    uv_fs_req_cleanup(&local_1c8);
    puStack_210 = (uv_fs_t *)0x176ed1;
    printf("output is: %s",output);
    if (CONCAT17(output[0xc],
                 CONCAT16(output[0xb],
                          CONCAT15(output[10],
                                   CONCAT14(output[9],
                                            CONCAT13(output[8],
                                                     CONCAT12(output[7],
                                                              CONCAT11(output[6],output[5]))))))) !=
        0xa646c726f7720 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x6f77206f6c6c6568) goto LAB_00176f6d;
    puStack_210 = (uv_fs_t *)0x176f04;
    unlink("stdout_file");
    puStack_210 = (uv_fs_t *)0x176f09;
    pcVar6 = (char *)uv_default_loop();
    puStack_210 = (uv_fs_t *)0x176f1d;
    uv_walk((uv_loop_t *)pcVar6,close_walk_cb,(void *)0x0);
    puStack_210 = (uv_fs_t *)0x176f27;
    uv_run((uv_loop_t *)pcVar6,UV_RUN_DEFAULT);
    puStack_210 = (uv_fs_t *)0x176f2c;
    puVar4 = uv_default_loop();
    puStack_210 = (uv_fs_t *)0x176f34;
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      puStack_210 = (uv_fs_t *)0x176f3d;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_210 = (uv_fs_t *)run_test_spawn_stdout_and_stderr_to_file;
  run_test_spawn_stdout_to_file_cold_8();
  pcVar7 = "stdout_file";
  puStack_218 = (uv_loop_t *)pcVar6;
  puStack_210 = (uv_fs_t *)unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  uVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_3d0,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  if (uVar1 == 0xffffffff) {
    run_test_spawn_stdout_and_stderr_to_file_cold_9();
LAB_00177166:
    run_test_spawn_stdout_and_stderr_to_file_cold_1();
LAB_0017716b:
    run_test_spawn_stdout_and_stderr_to_file_cold_2();
LAB_00177170:
    run_test_spawn_stdout_and_stderr_to_file_cold_3();
LAB_00177175:
    run_test_spawn_stdout_and_stderr_to_file_cold_4();
LAB_0017717a:
    run_test_spawn_stdout_and_stderr_to_file_cold_5();
LAB_0017717f:
    run_test_spawn_stdout_and_stderr_to_file_cold_6();
LAB_00177184:
    run_test_spawn_stdout_and_stderr_to_file_cold_7();
  }
  else {
    pcVar7 = (char *)(ulong)uVar1;
    uv_fs_req_cleanup(&uStack_3d0);
    options.stdio = &uStack_400;
    unaff_R14 = &options;
    uStack_400.flags = UV_IGNORE;
    uStack_3f0 = 2;
    uStack_3e0 = 2;
    options.stdio_count = 3;
    uStack_3e8 = uVar1;
    uStack_3d8 = uVar1;
    puVar4 = uv_default_loop();
    iVar2 = uv_spawn(puVar4,&process,&options);
    if (iVar2 != 0) goto LAB_00177166;
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_0017716b;
    if (exit_cb_called != 1) goto LAB_00177170;
    if (close_cb_called != 1) goto LAB_00177175;
    uStack_410 = uv_buf_init(output,0x400);
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&uStack_3d0,uVar1,&uStack_410,1,0,(uv_fs_cb)0x0);
    if (iVar2 != 0x1b) goto LAB_0017717a;
    unaff_R14 = (uv_process_options_t *)&uStack_3d0;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar1,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0017717f;
    uv_fs_req_cleanup(&uStack_3d0);
    printf("output is: %s",output);
    auVar14[0] = -(output[0xc] == 'h');
    auVar14[1] = -(output[0xd] == 'e');
    auVar14[2] = -(output[0xe] == 'l');
    auVar14[3] = -(output[0xf] == 'l');
    auVar14[4] = -(output[0x10] == 'o');
    auVar14[5] = -(output[0x11] == ' ');
    auVar14[6] = -(output[0x12] == 'e');
    auVar14[7] = -(output[0x13] == 'r');
    auVar14[8] = -(output[0x14] == 'r');
    auVar14[9] = -(output[0x15] == 'w');
    auVar14[10] = -(output[0x16] == 'o');
    auVar14[0xb] = -(output[0x17] == 'r');
    auVar14[0xc] = -(output[0x18] == 'l');
    auVar14[0xd] = -(output[0x19] == 'd');
    auVar14[0xe] = -(output[0x1a] == '\n');
    auVar14[0xf] = -(output[0x1b] == '\0');
    auVar12[0] = -(output[0] == 'h');
    auVar12[1] = -(output[1] == 'e');
    auVar12[2] = -(output[2] == 'l');
    auVar12[3] = -(output[3] == 'l');
    auVar12[4] = -(output[4] == 'o');
    auVar12[5] = -(output[5] == ' ');
    auVar12[6] = -(output[6] == 'w');
    auVar12[7] = -(output[7] == 'o');
    auVar12[8] = -(output[8] == 'r');
    auVar12[9] = -(output[9] == 'l');
    auVar12[10] = -(output[10] == 'd');
    auVar12[0xb] = -(output[0xb] == '\n');
    auVar12[0xc] = -(output[0xc] == 'h');
    auVar12[0xd] = -(output[0xd] == 'e');
    auVar12[0xe] = -(output[0xe] == 'l');
    auVar12[0xf] = -(output[0xf] == 'l');
    auVar12 = auVar12 & auVar14;
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00177184;
    unlink("stdout_file");
    pcVar7 = (char *)uv_default_loop();
    uv_walk((uv_loop_t *)pcVar7,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)pcVar7,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  run_test_spawn_stdout_and_stderr_to_file_cold_8();
  pcVar6 = "stdout_file";
  puStack_438 = (uv_loop_t *)pcVar7;
  puStack_430 = (uv_fs_t *)unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  uVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_5f0,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  if (uVar1 == 0xffffffff) {
    run_test_spawn_stdout_and_stderr_to_file2_cold_10();
LAB_00177396:
    run_test_spawn_stdout_and_stderr_to_file2_cold_9();
LAB_0017739b:
    run_test_spawn_stdout_and_stderr_to_file2_cold_1();
LAB_001773a0:
    run_test_spawn_stdout_and_stderr_to_file2_cold_2();
LAB_001773a5:
    run_test_spawn_stdout_and_stderr_to_file2_cold_3();
LAB_001773aa:
    run_test_spawn_stdout_and_stderr_to_file2_cold_4();
LAB_001773af:
    run_test_spawn_stdout_and_stderr_to_file2_cold_5();
LAB_001773b4:
    run_test_spawn_stdout_and_stderr_to_file2_cold_6();
LAB_001773b9:
    run_test_spawn_stdout_and_stderr_to_file2_cold_7();
  }
  else {
    pcVar6 = (char *)(ulong)uVar1;
    uv_fs_req_cleanup(&uStack_5f0);
    unaff_RBP = (void *)0x2;
    uVar1 = dup2(uVar1,2);
    if (uVar1 == 0xffffffff) goto LAB_00177396;
    pcVar6 = (char *)(ulong)uVar1;
    options.stdio = &uStack_628;
    unaff_R14 = &options;
    uStack_628.flags = UV_IGNORE;
    uStack_618 = 2;
    uStack_608 = 2;
    options.stdio_count = 3;
    uStack_610 = uVar1;
    uStack_600 = uVar1;
    puVar4 = uv_default_loop();
    iVar2 = uv_spawn(puVar4,&process,&options);
    if (iVar2 != 0) goto LAB_0017739b;
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_001773a0;
    if (exit_cb_called != 1) goto LAB_001773a5;
    if (close_cb_called != 1) goto LAB_001773aa;
    uStack_638 = uv_buf_init(output,0x400);
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&uStack_5f0,uVar1,&uStack_638,1,0,(uv_fs_cb)0x0);
    if (iVar2 != 0x1b) goto LAB_001773af;
    unaff_R14 = (uv_process_options_t *)&uStack_5f0;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar1,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001773b4;
    uv_fs_req_cleanup(&uStack_5f0);
    printf("output is: %s",output);
    auVar15[0] = -(output[0xc] == 'h');
    auVar15[1] = -(output[0xd] == 'e');
    auVar15[2] = -(output[0xe] == 'l');
    auVar15[3] = -(output[0xf] == 'l');
    auVar15[4] = -(output[0x10] == 'o');
    auVar15[5] = -(output[0x11] == ' ');
    auVar15[6] = -(output[0x12] == 'e');
    auVar15[7] = -(output[0x13] == 'r');
    auVar15[8] = -(output[0x14] == 'r');
    auVar15[9] = -(output[0x15] == 'w');
    auVar15[10] = -(output[0x16] == 'o');
    auVar15[0xb] = -(output[0x17] == 'r');
    auVar15[0xc] = -(output[0x18] == 'l');
    auVar15[0xd] = -(output[0x19] == 'd');
    auVar15[0xe] = -(output[0x1a] == '\n');
    auVar15[0xf] = -(output[0x1b] == '\0');
    auVar13[0] = -(output[0] == 'h');
    auVar13[1] = -(output[1] == 'e');
    auVar13[2] = -(output[2] == 'l');
    auVar13[3] = -(output[3] == 'l');
    auVar13[4] = -(output[4] == 'o');
    auVar13[5] = -(output[5] == ' ');
    auVar13[6] = -(output[6] == 'w');
    auVar13[7] = -(output[7] == 'o');
    auVar13[8] = -(output[8] == 'r');
    auVar13[9] = -(output[9] == 'l');
    auVar13[10] = -(output[10] == 'd');
    auVar13[0xb] = -(output[0xb] == '\n');
    auVar13[0xc] = -(output[0xc] == 'h');
    auVar13[0xd] = -(output[0xd] == 'e');
    auVar13[0xe] = -(output[0xe] == 'l');
    auVar13[0xf] = -(output[0xf] == 'l');
    auVar13 = auVar13 & auVar15;
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001773b9;
    unlink("stdout_file");
    pcVar6 = (char *)uv_default_loop();
    uv_walk((uv_loop_t *)pcVar6,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)pcVar6,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  run_test_spawn_stdout_and_stderr_to_file2_cold_8();
  pcVar7 = "stdout_file";
  pcStackY_878 = (code *)0x1773df;
  puStack_668 = (uv_loop_t *)pcVar6;
  puStack_660 = (uv_fs_t *)unaff_R14;
  unlink("stdout_file");
  pcStackY_878 = (code *)0x1773eb;
  unlink("stderr_file");
  pcStackY_878 = (code *)0x1773fe;
  init_process_options("spawn_helper6",exit_cb);
  pcStackY_878 = (code *)0x17741b;
  uVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_858,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  if (uVar1 == 0xffffffff) {
    pcStackY_878 = (code *)0x1776cc;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_15();
LAB_001776cc:
    pcStackY_878 = (code *)0x1776d1;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_14();
LAB_001776d1:
    pcStackY_878 = (code *)0x1776d6;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_13();
LAB_001776d6:
    pcStackY_878 = (code *)0x1776db;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_12();
LAB_001776db:
    pcStackY_878 = (code *)0x1776e0;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_1();
LAB_001776e0:
    pcStackY_878 = (code *)0x1776e5;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_2();
LAB_001776e5:
    pcStackY_878 = (code *)0x1776ea;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_3();
LAB_001776ea:
    pcStackY_878 = (code *)0x1776ef;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_4();
LAB_001776ef:
    pcStackY_878 = (code *)0x1776f4;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_5();
LAB_001776f4:
    pcStackY_878 = (code *)0x1776f9;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_6();
LAB_001776f9:
    pcStackY_878 = (code *)0x1776fe;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_7();
LAB_001776fe:
    pcStackY_878 = (code *)0x177703;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_8();
LAB_00177703:
    pcStackY_878 = (code *)0x177708;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_9();
LAB_00177708:
    pcStackY_878 = (code *)0x17770d;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_10();
  }
  else {
    pcVar7 = (char *)(ulong)uVar1;
    pcStackY_878 = (code *)0x177430;
    uv_fs_req_cleanup(&uStack_858);
    pcStackY_878 = (code *)0x17743c;
    uVar1 = dup2(uVar1,1);
    if (uVar1 == 0xffffffff) goto LAB_001776cc;
    unaff_RBP = (void *)(ulong)uVar1;
    pcStackY_878 = (code *)0x177468;
    uVar3 = uv_fs_open((uv_loop_t *)0x0,&uStack_858,"stderr_file",0x42,0x180,(uv_fs_cb)0x0);
    if (uVar3 == 0xffffffff) goto LAB_001776d1;
    pcVar7 = (char *)(ulong)uVar3;
    pcStackY_878 = (code *)0x17747d;
    uv_fs_req_cleanup(&uStack_858);
    unaff_R15._0_4_ = 2;
    unaff_R15._4_4_ = 0;
    pcStackY_878 = (code *)0x17748f;
    uVar3 = dup2(uVar3,2);
    if (uVar3 == 0xffffffff) goto LAB_001776d6;
    pcVar7 = (char *)(ulong)uVar3;
    options.stdio = &uStack_6a0;
    unaff_R14 = &options;
    uStack_6a0.flags = UV_IGNORE;
    uStack_690 = 2;
    uStack_680 = 2;
    options.stdio_count = 3;
    pcStackY_878 = (code *)0x1774d3;
    uStack_688 = uVar3;
    uStack_678 = uVar1;
    puVar4 = uv_default_loop();
    pcStackY_878 = (code *)0x1774e5;
    iVar2 = uv_spawn(puVar4,&process,&options);
    if (iVar2 != 0) goto LAB_001776db;
    pcStackY_878 = (code *)0x1774f2;
    puVar4 = uv_default_loop();
    pcStackY_878 = (code *)0x1774fc;
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_001776e0;
    if (exit_cb_called != 1) goto LAB_001776e5;
    if (close_cb_called != 1) goto LAB_001776ea;
    pcStackY_878 = (code *)0x17752f;
    uStack_868 = uv_buf_init(output,0x400);
    pcStackY_878 = (code *)0x17755a;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&uStack_858,uVar1,&uStack_868,1,0,(uv_fs_cb)0x0);
    if (iVar2 < 0xf) goto LAB_001776ef;
    unaff_R14 = (uv_process_options_t *)&uStack_858;
    pcStackY_878 = (code *)0x177570;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    pcStackY_878 = (code *)0x17757e;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar1,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001776f4;
    pcStackY_878 = (code *)0x177590;
    uv_fs_req_cleanup(&uStack_858);
    pcStackY_878 = (code *)0x1775a5;
    printf("output is: %s",output);
    if (CONCAT17(output[0xe],
                 CONCAT16(output[0xd],
                          CONCAT15(output[0xc],
                                   CONCAT14(output[0xb],
                                            CONCAT13(output[10],
                                                     CONCAT12(output[9],
                                                              CONCAT11(output[8],output[7]))))))) !=
        0xa646c726f777272 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x7265206f6c6c6568) goto LAB_001776f9;
    pcStackY_878 = (code *)0x1775f4;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&uStack_858,uVar3,&uStack_868,1,0,(uv_fs_cb)0x0);
    if (iVar2 < 0xc) goto LAB_001776fe;
    unaff_R14 = (uv_process_options_t *)&uStack_858;
    pcStackY_878 = (code *)0x17760a;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    pcStackY_878 = (code *)0x177618;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar3,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00177703;
    pcStackY_878 = (code *)0x17762a;
    uv_fs_req_cleanup(&uStack_858);
    pcStackY_878 = (code *)0x17763f;
    printf("output is: %s",output);
    if (CONCAT13(output[0xb],CONCAT12(output[10],CONCAT11(output[9],output[8]))) != 0xa646c72 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x6f77206f6c6c6568) goto LAB_00177708;
    pcStackY_878 = (code *)0x177672;
    unlink("stdout_file");
    pcStackY_878 = (code *)0x17767e;
    unlink("stderr_file");
    pcStackY_878 = (code *)0x177683;
    pcVar7 = (char *)uv_default_loop();
    pcStackY_878 = (code *)0x177697;
    uv_walk((uv_loop_t *)pcVar7,close_walk_cb,(void *)0x0);
    pcStackY_878 = (code *)0x1776a1;
    uv_run((uv_loop_t *)pcVar7,UV_RUN_DEFAULT);
    pcStackY_878 = (code *)0x1776a6;
    puVar4 = uv_default_loop();
    pcStackY_878 = (code *)0x1776ae;
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      pcStackY_878 = (code *)0x1776b7;
      uv_library_shutdown();
      return 0;
    }
  }
  pcStackY_878 = run_test_spawn_stdin;
  run_test_spawn_stdout_and_stderr_to_file_swap_cold_11();
  loop = (uv_loop_t *)&pvStackY_ba8;
  pvStackY_ba8 = (void *)0x72662d6f6c6c6568;
  auStackY_ba0._0_7_ = 0x776170732d6d6f;
  auStackY_ba0[7] = 'n';
  auStackY_ba0._8_7_ = 0x6e696474735f;
  pcStackY_bb0 = (code *)0x17774b;
  puStackY_888 = (uv_loop_t *)pcVar7;
  puStackY_880 = (uv_fs_t *)unaff_R14;
  pcStackY_878 = (code *)unaff_R15;
  init_process_options("spawn_helper3",exit_cb);
  pcStackY_bb0 = (code *)0x177750;
  puVar5 = uv_default_loop();
  puVar4 = (uv_loop_t *)&(&uStackY_b58)[1].type;
  pcStackY_bb0 = (code *)0x177765;
  uv_pipe_init(puVar5,(uv_pipe_t *)puVar4,0);
  pcStackY_bb0 = (code *)0x17776a;
  puVar5 = uv_default_loop();
  pcStackY_bb0 = (code *)0x17777c;
  uv_pipe_init(puVar5,(uv_pipe_t *)&uStackY_b58,0);
  options.stdio = &uStackY_b78;
  uStackY_b78.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  iStackY_b68 = 0x21;
  options.stdio_count = 2;
  pcStackY_bb0 = (code *)0x1777b3;
  uStackY_b78.data.stream = &uStackY_b58;
  puStackY_b60 = (uv_handle_type *)puVar4;
  puVar5 = uv_default_loop();
  iVar8 = 0x34b410;
  pcStackY_bb0 = (code *)0x1777c5;
  iVar2 = uv_spawn(puVar5,&process,&options);
  if (iVar2 == 0) {
    auStackY_ba0._32_8_ = (void *)0x17;
    puVar5 = (uv_loop_t *)(auStackY_a50 + 0x42);
    handle = &uStackY_b58;
    pcStackY_bb0 = (code *)0x1777fe;
    auStackY_ba0._24_8_ = &pvStackY_ba8;
    iVar2 = uv_write((uv_write_t *)puVar5,handle,(uv_buf_t *)(auStackY_ba0 + 0x18),1,write_cb);
    iVar8 = (int)handle;
    if (iVar2 != 0) goto LAB_001778ae;
    iVar8 = 0x176d27;
    puVar5 = (uv_loop_t *)&(&uStackY_b58)[1].type;
    pcStackY_bb0 = (code *)0x177821;
    iVar2 = uv_read_start((uv_stream_t *)puVar5,on_alloc,on_read);
    if (iVar2 != 0) goto LAB_001778b3;
    pcStackY_bb0 = (code *)0x17782e;
    puVar5 = uv_default_loop();
    iVar8 = 0;
    pcStackY_bb0 = (code *)0x177838;
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_001778b8;
    if (exit_cb_called != 1) goto LAB_001778bd;
    if (close_cb_called != 3) goto LAB_001778c2;
    iVar8 = 0x34b4a0;
    pcStackY_bb0 = (code *)0x17785d;
    iVar2 = strcmp((char *)&pvStackY_ba8,output);
    if (iVar2 != 0) goto LAB_001778c7;
    pcStackY_bb0 = (code *)0x177866;
    puVar4 = uv_default_loop();
    pcStackY_bb0 = (code *)0x17787a;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    iVar8 = 0;
    pcStackY_bb0 = (code *)0x177884;
    uv_run(puVar4,UV_RUN_DEFAULT);
    pcStackY_bb0 = (code *)0x177889;
    loop = uv_default_loop();
    pcStackY_bb0 = (code *)0x177891;
    iVar2 = uv_loop_close(loop);
    if (iVar2 == 0) {
      pcStackY_bb0 = (code *)0x17789a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStackY_bb0 = (code *)0x1778ae;
    run_test_spawn_stdin_cold_1();
LAB_001778ae:
    pcStackY_bb0 = (code *)0x1778b3;
    run_test_spawn_stdin_cold_2();
LAB_001778b3:
    pcStackY_bb0 = (code *)0x1778b8;
    run_test_spawn_stdin_cold_3();
LAB_001778b8:
    pcStackY_bb0 = (code *)0x1778bd;
    run_test_spawn_stdin_cold_4();
LAB_001778bd:
    pcStackY_bb0 = (code *)0x1778c2;
    run_test_spawn_stdin_cold_5();
LAB_001778c2:
    loop = puVar5;
    pcStackY_bb0 = (code *)0x1778c7;
    run_test_spawn_stdin_cold_6();
LAB_001778c7:
    pcStackY_bb0 = (code *)0x1778cc;
    run_test_spawn_stdin_cold_7();
  }
  pcStackY_bb0 = write_cb;
  run_test_spawn_stdin_cold_8();
  if (iVar8 == 0) {
    uv_close((uv_handle_t *)loop->pending_queue[1],close_cb);
    return extraout_EAX;
  }
  pcStackY_bb8 = run_test_spawn_stdio_greater_than_3;
  write_cb_cold_1();
  uStackY_e10.queued_fds = (void *)0x177909;
  auStackY_cd0._264_8_ = puVar4;
  aStackY_bc0.stream = &uStackY_b58;
  pcStackY_bb8 = (code *)unaff_RBP;
  init_process_options("spawn_helper5",exit_cb);
  uStackY_e10.queued_fds = (void *)0x17790e;
  puVar5 = uv_default_loop();
  puVar4 = (uv_loop_t *)auStackY_cd0;
  uStackY_e10.queued_fds = (void *)0x177922;
  uv_pipe_init(puVar5,(uv_pipe_t *)puVar4,0);
  uStackY_d18.flags = UV_IGNORE;
  uStackY_d08 = 0;
  uStackY_cf8 = 0;
  uStackY_ce8 = 0x21;
  options.stdio_count = 4;
  uStackY_e10.queued_fds = (void *)0x177955;
  options.stdio = &uStackY_d18;
  puStackY_ce0 = puVar4;
  puVar5 = uv_default_loop();
  uStackY_e10.queued_fds = (void *)0x177967;
  iVar2 = uv_spawn(puVar5,&process,&options);
  if (iVar2 == 0) {
    uStackY_e10.queued_fds = (void *)0x177987;
    iVar2 = uv_read_start((uv_stream_t *)auStackY_cd0,on_alloc,on_read);
    if (iVar2 != 0) goto LAB_00177a48;
    uStackY_e10.queued_fds = (void *)0x177994;
    puVar5 = uv_default_loop();
    uStackY_e10.queued_fds = (void *)0x17799e;
    iVar2 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_00177a4d;
    if (exit_cb_called != 1) goto LAB_00177a52;
    if (close_cb_called != 2) goto LAB_00177a57;
    uStackY_e10.queued_fds = (void *)0x1779d5;
    printf("output from stdio[3] is: %s",output);
    if (CONCAT17(output[0xe],
                 CONCAT16(output[0xd],
                          CONCAT15(output[0xc],
                                   CONCAT14(output[0xb],
                                            CONCAT13(output[10],
                                                     CONCAT12(output[9],
                                                              CONCAT11(output[8],output[7]))))))) !=
        0xa216f69647473 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x7320687472756f66) goto LAB_00177a5c;
    uStackY_e10.queued_fds = (void *)0x177a01;
    puVar4 = uv_default_loop();
    uStackY_e10.queued_fds = (void *)0x177a15;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uStackY_e10.queued_fds = (void *)0x177a1f;
    uv_run(puVar4,UV_RUN_DEFAULT);
    uStackY_e10.queued_fds = (void *)0x177a24;
    puVar5 = uv_default_loop();
    uStackY_e10.queued_fds = (void *)0x177a2c;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      uStackY_e10.queued_fds = (void *)0x177a35;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStackY_e10.queued_fds = (void *)0x177a48;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_00177a48:
    uStackY_e10.queued_fds = (void *)0x177a4d;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_00177a4d:
    uStackY_e10.queued_fds = (void *)0x177a52;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_00177a52:
    uStackY_e10.queued_fds = (void *)0x177a57;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_00177a57:
    uStackY_e10.queued_fds = (void *)0x177a5c;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_00177a5c:
    uStackY_e10.queued_fds = (void *)0x177a61;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  uStackY_e10.queued_fds = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  puStackY_e18 = (uv_loop_t *)0x177a72;
  puVar5 = uv_default_loop();
  puStackY_e18 = (uv_loop_t *)0x177a7d;
  iVar2 = uv_tcp_init(puVar5,&uStackY_e10);
  if (iVar2 == 0) {
    puStackY_e18 = (uv_loop_t *)0x177a8e;
    iVar2 = uv_tcp_open(&uStackY_e10,3);
    if (iVar2 != 0) goto LAB_00177ab7;
    puStackY_e18 = (uv_loop_t *)0x177aa1;
    iVar2 = uv_listen((uv_stream_t *)&uStackY_e10,0x1000,(uv_connection_cb)0x0);
    if (iVar2 == 0) {
      return 1;
    }
  }
  else {
    puStackY_e18 = (uv_loop_t *)0x177ab7;
    spawn_tcp_server_helper_cold_1();
LAB_00177ab7:
    puStackY_e18 = (uv_loop_t *)0x177abc;
    spawn_tcp_server_helper_cold_2();
  }
  puStackY_e18 = (uv_loop_t *)run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  puStackY_e18 = puVar4;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStackY_e68);
  if (iVar2 == 0) {
    uStackY_e6c = -1;
    puVar4 = uv_default_loop();
    iVar2 = uv_tcp_init_ex(puVar4,&tcp_server,2);
    if (iVar2 != 0) goto LAB_00177c27;
    iVar2 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStackY_e68,0);
    if (iVar2 != 0) goto LAB_00177c2c;
    iVar2 = uv_fileno((uv_handle_t *)&tcp_server,&uStackY_e6c);
    if (iVar2 != 0) goto LAB_00177c31;
    if (uStackY_e6c < 1) goto LAB_00177c36;
    options.stdio = &uStackY_e58;
    uStackY_e58.flags = UV_INHERIT_FD;
    uStackY_e58.data.fd = 0;
    uStackY_e48 = 2;
    uStackY_e40 = 1;
    uStackY_e38 = 2;
    uStackY_e30 = 2;
    uStackY_e28 = 2;
    iStackY_e20 = uStackY_e6c;
    options.stdio_count = 4;
    puVar4 = uv_default_loop();
    iVar2 = uv_spawn(puVar4,&process,&options);
    if (iVar2 != 0) goto LAB_00177c3b;
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_00177c40;
    if (exit_cb_called != 1) goto LAB_00177c45;
    if (close_cb_called != 1) goto LAB_00177c4a;
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_tcp_server_cold_1();
LAB_00177c27:
    run_test_spawn_tcp_server_cold_2();
LAB_00177c2c:
    run_test_spawn_tcp_server_cold_3();
LAB_00177c31:
    run_test_spawn_tcp_server_cold_4();
LAB_00177c36:
    run_test_spawn_tcp_server_cold_5();
LAB_00177c3b:
    run_test_spawn_tcp_server_cold_6();
LAB_00177c40:
    run_test_spawn_tcp_server_cold_7();
LAB_00177c45:
    run_test_spawn_tcp_server_cold_8();
LAB_00177c4a:
    run_test_spawn_tcp_server_cold_9();
  }
  run_test_spawn_tcp_server_cold_10();
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  puVar4 = uv_default_loop();
  iVar2 = uv_spawn(puVar4,&process,&options);
  if (iVar2 == 0) {
    puVar4 = uv_default_loop();
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_00177d06;
    if (exit_cb_called != 1) goto LAB_00177d0b;
    if (close_cb_called != 1) goto LAB_00177d10;
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_ignored_stdio_cold_1();
LAB_00177d06:
    run_test_spawn_ignored_stdio_cold_2();
LAB_00177d0b:
    run_test_spawn_ignored_stdio_cold_3();
LAB_00177d10:
    run_test_spawn_ignored_stdio_cold_4();
  }
  run_test_spawn_ignored_stdio_cold_5();
  init_process_options("spawn_helper4",kill_cb);
  loop_00 = (uv_timer_t *)uv_default_loop();
  puVar9 = &process;
  iVar2 = uv_spawn((uv_loop_t *)loop_00,&process,&options);
  if (iVar2 == 0) {
    loop_00 = (uv_timer_t *)uv_default_loop();
    puVar10 = &timer;
    iVar2 = uv_timer_init((uv_loop_t *)loop_00,&timer);
    pcVar11 = (code *)puVar10;
    if (iVar2 != 0) goto LAB_00177df2;
    loop_00 = &timer;
    pcVar11 = timer_cb;
    iVar2 = uv_timer_start(&timer,timer_cb,500,0);
    if (iVar2 != 0) goto LAB_00177df7;
    loop_00 = (uv_timer_t *)uv_default_loop();
    pcVar11 = (code *)0x0;
    iVar2 = uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    if (iVar2 != 0) goto LAB_00177dfc;
    if (exit_cb_called != 1) goto LAB_00177e01;
    if (close_cb_called != 2) goto LAB_00177e06;
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    pcVar11 = (code *)0x0;
    uv_run(puVar4,UV_RUN_DEFAULT);
    loop_00 = (uv_timer_t *)uv_default_loop();
    iVar2 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar2 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
    pcVar11 = (code *)puVar9;
LAB_00177df2:
    run_test_spawn_and_kill_cold_2();
LAB_00177df7:
    run_test_spawn_and_kill_cold_3();
LAB_00177dfc:
    run_test_spawn_and_kill_cold_4();
LAB_00177e01:
    run_test_spawn_and_kill_cold_5();
LAB_00177e06:
    run_test_spawn_and_kill_cold_6();
  }
  run_test_spawn_and_kill_cold_7();
  pcVar6 = "exit_cb";
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if ((uv_timer_t *)pcVar11 == (uv_timer_t *)0x0) {
    if (extraout_EDX == 0xf) {
      uv_close((uv_handle_t *)loop_00,close_cb);
      pcVar6 = (char *)(ulong)*(uint *)&((uv_loop_t *)loop_00)->watchers;
      iVar2 = uv_kill(*(uint *)&((uv_loop_t *)loop_00)->watchers,0);
      if (iVar2 == -3) {
        return -3;
      }
      goto LAB_00177e65;
    }
  }
  else {
    kill_cb_cold_1();
  }
  kill_cb_cold_2();
LAB_00177e65:
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  uv_close((uv_handle_t *)pcVar6,close_cb);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(spawn_stdout_to_file) {
  int r;
  uv_file file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[2];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");

  init_process_options("spawn_helper2", exit_cb);

  r = uv_fs_open(NULL, &fs_req, "stdout_file", O_CREAT | O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);

  file = r;

  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.fd = file;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  buf = uv_buf_init(output, sizeof(output));
  r = uv_fs_read(NULL, &fs_req, file, &buf, 1, 0, NULL);
  ASSERT(r == 12);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strcmp("hello world\n", output) == 0);

  /* Cleanup. */
  unlink("stdout_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}